

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::Struct::Struct
          (Struct *this,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *types)

{
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppTVar4;
  
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Type).kind_ = kStruct;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Struct_00b19680;
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::vector(&this->element_types_,types);
  p_Var1 = &(this->element_decorations_)._M_t._M_impl.super__Rb_tree_header;
  (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppTVar4 = (types->
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (types->
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppTVar4 == ppTVar2) {
      return;
    }
    iVar3 = (*(*ppTVar4)->_vptr_Type[6])();
    if (CONCAT44(extraout_var,iVar3) != 0) break;
    ppTVar4 = ppTVar4 + 1;
  }
  __assert_fail("!t->AsVoid()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/types.cpp"
                ,0x214,"spvtools::opt::analysis::Struct::Struct(const std::vector<const Type *> &)")
  ;
}

Assistant:

Struct::Struct(const std::vector<const Type*>& types)
    : Type(kStruct), element_types_(types) {
  for (const auto* t : types) {
    (void)t;
    assert(!t->AsVoid());
  }
}